

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StartResumeReliablePdu.cpp
# Opt level: O0

bool __thiscall
DIS::StartResumeReliablePdu::operator==(StartResumeReliablePdu *this,StartResumeReliablePdu *rhs)

{
  bool bVar1;
  bool local_19;
  bool ivarsEqual;
  StartResumeReliablePdu *rhs_local;
  StartResumeReliablePdu *this_local;
  
  local_19 = SimulationManagementWithReliabilityFamilyPdu::operator==
                       (&this->super_SimulationManagementWithReliabilityFamilyPdu,
                        &rhs->super_SimulationManagementWithReliabilityFamilyPdu);
  bVar1 = ClockTime::operator==(&this->_realWorldTime,&rhs->_realWorldTime);
  if (!bVar1) {
    local_19 = false;
  }
  bVar1 = ClockTime::operator==(&this->_simulationTime,&rhs->_simulationTime);
  if (!bVar1) {
    local_19 = false;
  }
  if (this->_requiredReliabilityService != rhs->_requiredReliabilityService) {
    local_19 = false;
  }
  if (this->_pad1 != rhs->_pad1) {
    local_19 = false;
  }
  if (this->_pad2 != rhs->_pad2) {
    local_19 = false;
  }
  if (this->_requestID != rhs->_requestID) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool StartResumeReliablePdu::operator ==(const StartResumeReliablePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = SimulationManagementWithReliabilityFamilyPdu::operator==(rhs);

     if( ! (_realWorldTime == rhs._realWorldTime) ) ivarsEqual = false;
     if( ! (_simulationTime == rhs._simulationTime) ) ivarsEqual = false;
     if( ! (_requiredReliabilityService == rhs._requiredReliabilityService) ) ivarsEqual = false;
     if( ! (_pad1 == rhs._pad1) ) ivarsEqual = false;
     if( ! (_pad2 == rhs._pad2) ) ivarsEqual = false;
     if( ! (_requestID == rhs._requestID) ) ivarsEqual = false;

    return ivarsEqual;
 }